

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  unsigned_long_long uVar2;
  double dVar3;
  ImVec2 IVar4;
  int iVar5;
  ImU32 IVar6;
  uint uVar7;
  GetterXsYRef<unsigned_long_long> *pGVar8;
  TransformerLinLog *pTVar9;
  ImPlotPlot *pIVar10;
  ImDrawVert *pIVar11;
  ImDrawIdx *pIVar12;
  ImPlotContext *pIVar13;
  ImPlotContext *pIVar14;
  ImDrawIdx IVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  
  pIVar13 = GImPlot;
  pGVar8 = this->Getter1;
  pTVar9 = this->Transformer;
  iVar5 = pGVar8->Count;
  uVar2 = *(unsigned_long_long *)
           ((long)pGVar8->Xs +
           (long)(((pGVar8->Offset + prim) % iVar5 + iVar5) % iVar5) * (long)pGVar8->Stride);
  auVar21._0_8_ = (double)CONCAT44(0x43300000,(int)uVar2);
  auVar21._8_4_ = (int)(uVar2 >> 0x20);
  auVar21._12_4_ = 0x45300000;
  dVar20 = log10(pGVar8->YRef / GImPlot->CurrentPlot->YAxis[pTVar9->YAxis].Range.Min);
  pIVar14 = GImPlot;
  iVar5 = pTVar9->YAxis;
  pIVar10 = pIVar13->CurrentPlot;
  dVar3 = pIVar10->YAxis[iVar5].Range.Min;
  fVar23 = (float)((((auVar21._8_8_ - 1.9342813113834067e+25) + (auVar21._0_8_ - 4503599627370496.0)
                    ) - (pIVar10->XAxis).Range.Min) * pIVar13->Mx +
                  (double)pIVar13->PixelRange[iVar5].Min.x);
  fVar17 = (float)((((double)(float)(dVar20 / pIVar13->LogDenY[iVar5]) *
                     (pIVar10->YAxis[iVar5].Range.Max - dVar3) + dVar3) - dVar3) *
                   pIVar13->My[iVar5] + (double)pIVar13->PixelRange[iVar5].Min.y);
  pGVar8 = this->Getter2;
  pTVar9 = this->Transformer;
  iVar5 = pGVar8->Count;
  uVar2 = *(unsigned_long_long *)
           ((long)pGVar8->Xs +
           (long)(((prim + pGVar8->Offset) % iVar5 + iVar5) % iVar5) * (long)pGVar8->Stride);
  auVar22._0_8_ = (double)CONCAT44(0x43300000,(int)uVar2);
  auVar22._8_4_ = (int)(uVar2 >> 0x20);
  auVar22._12_4_ = 0x45300000;
  dVar20 = log10(pGVar8->YRef / GImPlot->CurrentPlot->YAxis[pTVar9->YAxis].Range.Min);
  iVar5 = pTVar9->YAxis;
  pIVar10 = pIVar14->CurrentPlot;
  dVar3 = pIVar10->YAxis[iVar5].Range.Min;
  fVar24 = (float)((((auVar22._8_8_ - 1.9342813113834067e+25) + (auVar22._0_8_ - 4503599627370496.0)
                    ) - (pIVar10->XAxis).Range.Min) * pIVar14->Mx +
                  (double)pIVar14->PixelRange[iVar5].Min.x);
  fVar25 = (float)((((double)(float)(dVar20 / pIVar14->LogDenY[iVar5]) *
                     (pIVar10->YAxis[iVar5].Range.Max - dVar3) + dVar3) - dVar3) *
                   pIVar14->My[iVar5] + (double)pIVar14->PixelRange[iVar5].Min.y);
  fVar18 = fVar17;
  if (fVar25 <= fVar17) {
    fVar18 = fVar25;
  }
  bVar16 = false;
  if ((fVar18 < (cull_rect->Max).y) &&
     (fVar18 = (float)(~-(uint)(fVar25 <= fVar17) & (uint)fVar25 |
                      -(uint)(fVar25 <= fVar17) & (uint)fVar17), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar18 && fVar18 != *pfVar1)) {
    fVar18 = fVar23;
    if (fVar24 <= fVar23) {
      fVar18 = fVar24;
    }
    bVar16 = false;
    if (fVar18 < (cull_rect->Max).x) {
      fVar18 = (float)(~-(uint)(fVar24 <= fVar23) & (uint)fVar24 |
                      -(uint)(fVar24 <= fVar23) & (uint)fVar23);
      bVar16 = (cull_rect->Min).x <= fVar18 && fVar18 != (cull_rect->Min).x;
    }
  }
  if (bVar16 != false) {
    fVar18 = this->Weight;
    IVar6 = this->Col;
    IVar4 = *uv;
    fVar26 = fVar24 - fVar23;
    fVar27 = fVar25 - fVar17;
    fVar19 = fVar26 * fVar26 + fVar27 * fVar27;
    if (0.0 < fVar19) {
      if (fVar19 < 0.0) {
        fVar19 = sqrtf(fVar19);
      }
      else {
        fVar19 = SQRT(fVar19);
      }
      fVar26 = fVar26 * (1.0 / fVar19);
      fVar27 = fVar27 * (1.0 / fVar19);
    }
    fVar18 = fVar18 * 0.5;
    fVar26 = fVar26 * fVar18;
    fVar18 = fVar18 * fVar27;
    pIVar11 = DrawList->_VtxWritePtr;
    (pIVar11->pos).x = fVar18 + fVar23;
    (pIVar11->pos).y = fVar17 - fVar26;
    pIVar11->uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar6;
    pIVar11[1].pos.x = fVar18 + fVar24;
    pIVar11[1].pos.y = fVar25 - fVar26;
    pIVar11[1].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar6;
    pIVar11[2].pos.x = fVar24 - fVar18;
    pIVar11[2].pos.y = fVar26 + fVar25;
    pIVar11[2].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar6;
    pIVar11[3].pos.x = fVar23 - fVar18;
    pIVar11[3].pos.y = fVar26 + fVar17;
    pIVar11[3].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    pIVar12 = DrawList->_IdxWritePtr;
    IVar15 = (ImDrawIdx)uVar7;
    *pIVar12 = IVar15;
    pIVar12[1] = IVar15 + 1;
    pIVar12[2] = IVar15 + 2;
    pIVar12[3] = IVar15;
    pIVar12[4] = IVar15 + 2;
    pIVar12[5] = IVar15 + 3;
    DrawList->_IdxWritePtr = pIVar12 + 6;
    DrawList->_VtxCurrentIdx = uVar7 + 4;
  }
  return bVar16;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }